

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool __thiscall ExpressionContext::IsIntegerType(ExpressionContext *this,TypeBase *type)

{
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  if (type == this->typeBool) {
    this_local._7_1_ = true;
  }
  else if (type == this->typeChar) {
    this_local._7_1_ = true;
  }
  else if (type == this->typeShort) {
    this_local._7_1_ = true;
  }
  else if (type == this->typeInt) {
    this_local._7_1_ = true;
  }
  else if (type == this->typeLong) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ExpressionContext::IsIntegerType(TypeBase* type)
{
	if(type == typeBool)
		return true;

	if(type == typeChar)
		return true;

	if(type == typeShort)
		return true;

	if(type == typeInt)
		return true;

	if(type == typeLong)
		return true;

	return false;
}